

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

pair<const_char_*,_int> google::protobuf::internal::ReadSizeFallback(char *p,uint32_t res)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  char *pcVar4;
  pair<const_char_*,_int> pVar5;
  pair<const_char_*,_int> pVar6;
  
  pVar5.first = (byte *)(p + 1);
  lVar3 = -0x15;
  do {
    if (lVar3 == 0) {
      if ((byte)p[4] < 8) {
        uVar2 = res + (uint)(byte)p[4] * 0x10000000 + 0xf0000000;
        pcVar4 = p + 5;
        if (0x7fffffef < uVar2) {
          uVar2 = 0;
          pcVar4 = (char *)0x0;
        }
        pVar6.second = uVar2;
        pVar6.first = pcVar4;
        pVar6._12_4_ = 0;
        return pVar6;
      }
      return (pair<const_char_*,_int>)ZEXT816(0);
    }
    bVar1 = *pVar5.first;
    pVar5.second = res + (bVar1 - 1 << ((char)lVar3 + 0x1cU & 0x1f));
    pVar5.first = pVar5.first + 1;
    lVar3 = lVar3 + 7;
    res = pVar5.second;
  } while ((char)bVar1 < '\0');
  pVar5._12_4_ = 0;
  return pVar5;
}

Assistant:

std::pair<const char*, int32_t> ReadSizeFallback(const char* p, uint32_t res) {
  for (std::uint32_t i = 1; i < 4; i++) {
    uint32_t byte = static_cast<uint8_t>(p[i]);
    res += (byte - 1) << (7 * i);
    if (PROTOBUF_PREDICT_TRUE(byte < 128)) {
      return {p + i + 1, res};
    }
  }
  std::uint32_t byte = static_cast<uint8_t>(p[4]);
  if (PROTOBUF_PREDICT_FALSE(byte >= 8)) return {nullptr, 0};  // size >= 2gb
  res += (byte - 1) << 28;
  // Protect against sign integer overflow in PushLimit. Limits are relative
  // to buffer ends and ptr could potential be kSlopBytes beyond a buffer end.
  // To protect against overflow we reject limits absurdly close to INT_MAX.
  if (PROTOBUF_PREDICT_FALSE(res > INT_MAX - ParseContext::kSlopBytes)) {
    return {nullptr, 0};
  }
  return {p + 5, res};
}